

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

bool __thiscall BamTools::ConvertTool::ConvertToolPrivate::Run(ConvertToolPrivate *this)

{
  byte bVar1;
  bool bVar2;
  __type _Var3;
  _Ios_Openmode _Var4;
  char *pcVar5;
  ostream *poVar6;
  istream *piVar7;
  long *in_RDI;
  BamAlignment a;
  offset_in_ConvertToolPrivate_to_subr pFunction;
  bool formatError;
  bool convertedOk;
  ofstream outFile;
  BamRegion region;
  BamMultiReader reader;
  string line;
  ifstream filelist;
  BamAlignment *in_stack_fffffffffffff8e8;
  BamAlignment *in_stack_fffffffffffff8f0;
  value_type *in_stack_fffffffffffff8f8;
  undefined7 in_stack_fffffffffffff900;
  undefined1 in_stack_fffffffffffff907;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff910;
  BamAlignment *in_stack_fffffffffffff930;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *in_stack_fffffffffffff988;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  undefined1 local_620 [152];
  BamRegion *in_stack_fffffffffffffa78;
  BamMultiReader *in_stack_fffffffffffffa80;
  ConvertToolPrivate *in_stack_fffffffffffffa88;
  string local_4c8 [32];
  BamAlignment *local_4a8;
  long local_4a0;
  byte local_492;
  byte local_491;
  long local_490 [64];
  int local_290 [4];
  BamRegion local_280 [2];
  undefined4 local_254;
  string local_248 [32];
  int local_228;
  istream local_218 [535];
  byte local_1;
  
  if (((*(byte *)*in_RDI & 1) == 0) && ((*(byte *)(*in_RDI + 1) & 1) == 0)) {
    Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                in_stack_fffffffffffff8f8);
  }
  if ((*(byte *)(*in_RDI + 1) & 1) != 0) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_218,pcVar5,_S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "bamtools convert ERROR: could not open input BAM file list... Aborting."
                              );
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
      local_228 = 1;
    }
    else {
      std::__cxx11::string::string(local_248);
      while( true ) {
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_248)
        ;
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
        if (!bVar2) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                    in_stack_fffffffffffff8f8);
      }
      std::__cxx11::string::~string(local_248);
      local_228 = 0;
    }
    std::ifstream::~ifstream(local_218);
    if (local_228 != 0) goto LAB_001f2389;
  }
  BamMultiReader::BamMultiReader
            ((BamMultiReader *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
  bVar2 = BamMultiReader::Open
                    ((BamMultiReader *)in_stack_fffffffffffff8f0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff8e8);
  if (bVar2) {
    if (((*(byte *)*in_RDI & 1) != 0) && ((*(byte *)(*in_RDI + 4) & 1) != 0)) {
      local_254 = 1;
      in_stack_fffffffffffff997 =
           BamMultiReader::LocateIndexes
                     ((BamMultiReader *)in_stack_fffffffffffff8f0,
                      (IndexType *)in_stack_fffffffffffff8e8);
      if (((in_stack_fffffffffffff997 ^ 0xff) & 1) != 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "bamtools convert ERROR: could not locate index file(s)... Aborting."
                                );
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
        local_228 = 1;
        goto LAB_001f236b;
      }
    }
    BamMultiReader::GetReferenceData((BamMultiReader *)in_stack_fffffffffffff8e8);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator=
              ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
               CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
               in_stack_fffffffffffff988);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector
              ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
               CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    local_290[3] = 0xffffffff;
    local_290[2] = 0xffffffff;
    local_290[1] = 0xffffffff;
    local_290[0] = -1;
    BamRegion::BamRegion(local_280,local_290 + 3,local_290 + 2,local_290 + 1,local_290);
    if ((*(byte *)(*in_RDI + 4) & 1) == 0) {
LAB_001f1d88:
      std::ofstream::ofstream(local_490);
      if ((*(byte *)(*in_RDI + 2) & 1) == 0) {
LAB_001f1eda:
        local_491 = 1;
        _Var3 = std::operator==(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        if (_Var3) {
          local_491 = RunPileupConversion(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
        }
        else {
          local_492 = 0;
          local_4a0 = 0;
          local_4a8 = (BamAlignment *)0x0;
          _Var3 = std::operator==(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
          if (_Var3) {
            local_4a8 = (BamAlignment *)PrintBed;
            local_4a0 = 0;
          }
          else {
            _Var3 = std::operator==(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
            if (_Var3) {
              local_4a8 = (BamAlignment *)PrintFasta;
              local_4a0 = 0;
            }
            else {
              _Var3 = std::operator==(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
              if (_Var3) {
                local_4a8 = (BamAlignment *)PrintFastq;
                local_4a0 = 0;
              }
              else {
                _Var3 = std::operator==(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
                if (_Var3) {
                  local_4a8 = (BamAlignment *)PrintJson;
                  local_4a0 = 0;
                }
                else {
                  _Var3 = std::operator==(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
                  if (_Var3) {
                    local_4a8 = (BamAlignment *)PrintSam;
                    local_4a0 = 0;
                  }
                  else {
                    _Var3 = std::operator==(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
                    if (_Var3) {
                      local_4a8 = (BamAlignment *)PrintYaml;
                      local_4a0 = 0;
                    }
                    else {
                      poVar6 = std::operator<<((ostream *)&std::cerr,
                                               "bamtools convert ERROR: unrecognized format: ");
                      poVar6 = std::operator<<(poVar6,(string *)(*in_RDI + 0x60));
                      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                      in_stack_fffffffffffff910 =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::operator<<((ostream *)&std::cerr,
                                           "Please see documentation for list of supported formats "
                                          );
                      std::ostream::operator<<
                                (in_stack_fffffffffffff910,std::endl<char,std::char_traits<char>>);
                      local_492 = 1;
                      local_491 = 0;
                    }
                  }
                }
              }
            }
          }
          if ((local_492 & 1) == 0) {
            _Var3 = std::operator==(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
            if ((_Var3) && ((*(byte *)(*in_RDI + 6) & 1) == 0)) {
              poVar6 = (ostream *)(in_RDI + 4);
              BamMultiReader::GetHeaderText_abi_cxx11_((BamMultiReader *)in_stack_fffffffffffff8e8);
              std::operator<<(poVar6,local_4c8);
              std::__cxx11::string::~string(local_4c8);
            }
            BamAlignment::BamAlignment(in_stack_fffffffffffff930);
            while (bVar2 = BamMultiReader::GetNextAlignment
                                     ((BamMultiReader *)in_stack_fffffffffffff8f0,
                                      in_stack_fffffffffffff8e8), bVar2) {
              in_stack_fffffffffffff8e8 = local_4a8;
              if (((ulong)local_4a8 & 1) != 0) {
                in_stack_fffffffffffff8e8 =
                     *(BamAlignment **)((long)local_4a8 + *(long *)((long)in_RDI + local_4a0) + -1);
              }
              in_stack_fffffffffffff8f0 = local_4a8;
              (*(code *)in_stack_fffffffffffff8e8)((long *)((long)in_RDI + local_4a0),local_620);
            }
            local_491 = 1;
            BamAlignment::~BamAlignment(in_stack_fffffffffffff8f0);
          }
        }
        BamMultiReader::Close((BamMultiReader *)0x1f230e);
        if ((*(byte *)(*in_RDI + 2) & 1) != 0) {
          std::ofstream::close();
        }
        local_1 = local_491 & 1;
      }
      else {
        _Var4 = std::__cxx11::string::c_str();
        std::ofstream::open((char *)local_490,_Var4);
        bVar1 = std::ios::operator!((ios *)((long)local_490 + *(long *)(local_490[0] + -0x18)));
        if ((bVar1 & 1) == 0) {
          in_stack_fffffffffffff930 =
               (BamAlignment *)((long)in_RDI + *(long *)(in_RDI[4] + -0x18) + 0x20);
          std::ofstream::rdbuf();
          std::ios::rdbuf((streambuf *)in_stack_fffffffffffff930);
          goto LAB_001f1eda;
        }
        poVar6 = std::operator<<((ostream *)&std::cerr,"bamtools convert ERROR: could not open ");
        poVar6 = std::operator<<(poVar6,(string *)(*in_RDI + 0x40));
        poVar6 = std::operator<<(poVar6," for output");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
      }
      local_228 = 1;
      std::ofstream::~ofstream(local_490);
    }
    else {
      bVar2 = Utilities::ParseRegionString
                        ((string *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                         in_stack_fffffffffffffa78);
      if (bVar2) {
        bVar2 = BamMultiReader::HasIndexes((BamMultiReader *)0x1f1c0a);
        if ((!bVar2) ||
           (bVar2 = BamMultiReader::SetRegion
                              ((BamMultiReader *)in_stack_fffffffffffff8f0,
                               (BamRegion *)in_stack_fffffffffffff8e8), bVar2)) goto LAB_001f1d88;
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "bamtools convert ERROR: set region failed. Check that REGION describes a valid range"
                                );
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        BamMultiReader::Close((BamMultiReader *)0x1f1c92);
        local_1 = 0;
        local_228 = 1;
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "bamtools convert ERROR: could not parse REGION: ");
        poVar6 = std::operator<<(poVar6,(string *)(*in_RDI + 0x80));
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "Check that REGION is in valid format (see documentation) and that the coordinates are valid"
                                );
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        BamMultiReader::Close((BamMultiReader *)0x1f1d6c);
        local_1 = 0;
        local_228 = 1;
      }
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "bamtools convert ERROR: could not open input BAM file(s)... Aborting."
                            );
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    local_228 = 1;
  }
LAB_001f236b:
  BamMultiReader::~BamMultiReader((BamMultiReader *)in_stack_fffffffffffff8f0);
LAB_001f2389:
  return (bool)(local_1 & 1);
}

Assistant:

bool ConvertTool::ConvertToolPrivate::Run()
{

    // ------------------------------------
    // initialize conversion input/output

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist)
        m_settings->InputFiles.push_back(Options::StandardIn());

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools convert ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line))
            m_settings->InputFiles.push_back(line);
    }

    // open input files
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools convert ERROR: could not open input BAM file(s)... Aborting."
                  << std::endl;
        return false;
    }

    // if input is not stdin & a region is provided, look for index files
    if (m_settings->HasInput && m_settings->HasRegion) {
        if (!reader.LocateIndexes()) {
            std::cerr << "bamtools convert ERROR: could not locate index file(s)... Aborting."
                      << std::endl;
            return false;
        }
    }

    // retrieve reference data
    m_references = reader.GetReferenceData();

    // set region if specified
    BamRegion region;
    if (m_settings->HasRegion) {
        if (Utilities::ParseRegionString(m_settings->Region, reader, region)) {

            if (reader.HasIndexes()) {
                if (!reader.SetRegion(region)) {
                    std::cerr << "bamtools convert ERROR: set region failed. Check that REGION "
                                 "describes a valid range"
                              << std::endl;
                    reader.Close();
                    return false;
                }
            }

        } else {
            std::cerr << "bamtools convert ERROR: could not parse REGION: " << m_settings->Region
                      << std::endl;
            std::cerr << "Check that REGION is in valid format (see documentation) and that the "
                         "coordinates are valid"
                      << std::endl;
            reader.Close();
            return false;
        }
    }

    // if output file given
    std::ofstream outFile;
    if (m_settings->HasOutput) {

        // open output file stream
        outFile.open(m_settings->OutputFilename.c_str());
        if (!outFile) {
            std::cerr << "bamtools convert ERROR: could not open " << m_settings->OutputFilename
                      << " for output" << std::endl;
            return false;
        }

        // set m_out to file's streambuf
        m_out.rdbuf(outFile.rdbuf());
    }

    // -------------------------------------
    // do conversion based on format

    bool convertedOk = true;

    // pileup is special case
    // conversion not done per alignment, like the other formats
    if (m_settings->Format == FORMAT_PILEUP) convertedOk = RunPileupConversion(&reader);

    // all other formats
    else {

        bool formatError = false;

        // set function pointer to proper conversion method
        void (BamTools::ConvertTool::ConvertToolPrivate::*pFunction)(const BamAlignment&) = 0;
        if (m_settings->Format == FORMAT_BED)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintBed;
        else if (m_settings->Format == FORMAT_FASTA)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintFasta;
        else if (m_settings->Format == FORMAT_FASTQ)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintFastq;
        else if (m_settings->Format == FORMAT_JSON)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintJson;
        else if (m_settings->Format == FORMAT_SAM)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintSam;
        else if (m_settings->Format == FORMAT_YAML)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintYaml;
        else {
            std::cerr << "bamtools convert ERROR: unrecognized format: " << m_settings->Format
                      << std::endl;
            std::cerr << "Please see documentation for list of supported formats " << std::endl;
            formatError = true;
            convertedOk = false;
        }

        // if format selected ok
        if (!formatError) {

            // if SAM format & not omitting header, print SAM header first
            if ((m_settings->Format == FORMAT_SAM) && !m_settings->IsOmittingSamHeader)
                m_out << reader.GetHeaderText();

            // iterate through file, doing conversion
            BamAlignment a;
            while (reader.GetNextAlignment(a))
                (this->*pFunction)(a);

            // set flag for successful conversion
            convertedOk = true;
        }
    }

    // ------------------------
    // clean up & exit
    reader.Close();
    if (m_settings->HasOutput) outFile.close();
    return convertedOk;
}